

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O3

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::WriteSparseArrayIndexProperties
          (SerializationCloner<Js::StreamWriter> *this,JavascriptArray *arr)

{
  bool bVar1;
  int iVar2;
  ES5Array *arr_00;
  
  bVar1 = JavascriptArray::IsNonES5Array(arr);
  if (!bVar1) {
    arr_00 = VarTo<Js::ES5Array,Js::JavascriptArray>(arr);
    WriteSparseArrayIndexProperties<Js::ES5ArrayIndexStaticEnumerator<false>,Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayItemAccessor>
              (this,arr_00);
    return;
  }
  iVar2 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])
                    (arr);
  if (iVar2 != 0) {
    WriteSparseArrayIndexProperties<Js::JavascriptArrayIndexStaticEnumerator,Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayItemAccessor>
              (this,arr);
    return;
  }
  WriteSparseArrayIndexProperties<Js::JavascriptArrayIndexStaticEnumerator,Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayDirectItemAccessor>
            (this,arr);
  return;
}

Assistant:

void SerializationCloner<Writer>::WriteSparseArrayIndexProperties(JavascriptArray* arr)
    {
        if (JavascriptArray::IsNonES5Array(arr))
        {
            if (!arr->IsCrossSiteObject())
            {
                WriteSparseArrayIndexProperties<
                    JavascriptArrayIndexStaticEnumerator, JavascriptArrayDirectItemAccessor>(arr);
            }
            else
            {
                WriteSparseArrayIndexProperties<
                    JavascriptArrayIndexStaticEnumerator, JavascriptArrayItemAccessor>(arr);
            }
        }
        else
        {
            // We don't need JavascriptArrayEnumerableItemAccessor to check enumberable since we'll
            // enumerate enumerable index named properties through ES5ArrayIndexEnumerator. Just use
            // JavascriptArrayItemAccessor.
            WriteSparseArrayIndexProperties<
                ES5ArrayIndexStaticEnumerator<>, JavascriptArrayItemAccessor>(VarTo<ES5Array>(arr));
        }
    }